

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

void __thiscall Js::ScriptContext::EnsureClearDebugDocument(ScriptContext *this)

{
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar1;
  Utf8SourceInfo *this_00;
  int iVar2;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar3;
  long lVar4;
  
  if ((this->sourceList).ptr !=
      (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
       *)0x0) {
    pLVar3 = Memory::
             RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
             ::operator->(&this->sourceList);
    iVar2 = (pLVar3->
            super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
            ).count;
    if (0 < iVar2) {
      lVar4 = 0;
      do {
        pRVar1 = (pLVar3->
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                 ).buffer.ptr[lVar4].ptr;
        if ((((ulong)pRVar1 & 1) == 0 && pRVar1 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0)
           && (this_00 = (Utf8SourceInfo *)(pRVar1->super_RecyclerWeakReferenceBase).strongRef,
              this_00 != (Utf8SourceInfo *)0x0)) {
          Utf8SourceInfo::ClearDebugDocument(this_00,true);
          iVar2 = (pLVar3->
                  super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                  ).count;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar2);
    }
  }
  return;
}

Assistant:

void ScriptContext::EnsureClearDebugDocument()
    {
        if (this->sourceList)
        {
            this->sourceList->Map([=](uint i, RecyclerWeakReference<Js::Utf8SourceInfo>* sourceInfoWeakRef) {
                Js::Utf8SourceInfo* sourceInfo = sourceInfoWeakRef->Get();
                if (sourceInfo)
                {
                    sourceInfo->ClearDebugDocument();
                }
            });
        }
    }